

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Cues::Init(Cues *this)

{
  IMkvReader *pReader;
  bool bVar1;
  longlong lVar2;
  longlong lVar3;
  bool bVar4;
  longlong idpos;
  long pos;
  long lVar5;
  long pos_00;
  long len;
  long cue_points_size;
  long local_50;
  long local_48;
  Cues *local_40;
  long local_38;
  
  bVar4 = true;
  if (this->m_cue_points == (CuePoint **)0x0) {
    if (this->m_preload_count == 0 && this->m_count == 0) {
      pReader = this->m_pSegment->m_pReader;
      local_48 = this->m_size + this->m_start;
      local_38 = 0;
      pos = this->m_start;
      local_40 = this;
      do {
        lVar5 = local_48;
        bVar4 = local_48 <= pos;
        if (local_48 <= pos) {
          return bVar4;
        }
        lVar2 = ReadID(pReader,pos,&local_50);
        if ((lVar2 < 0) || (pos_00 = local_50 + pos, lVar5 < pos_00)) {
          bVar1 = false;
          pos_00 = pos;
        }
        else {
          lVar3 = ReadUInt(pReader,pos_00,&local_50);
          if (lVar3 < 0) {
            bVar1 = false;
          }
          else {
            lVar5 = local_50 + pos_00;
            if (local_48 < lVar5) {
              bVar1 = false;
            }
            else {
              pos_00 = lVar3 + lVar5;
              if ((local_48 < pos_00) ||
                 ((lVar2 == 0xbb && (bVar1 = PreloadCuePoint(local_40,&local_38,pos), !bVar1)))) {
                bVar1 = false;
                pos_00 = lVar5;
              }
              else {
                bVar1 = true;
              }
            }
          }
        }
        pos = pos_00;
      } while (bVar1);
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Cues::Init() const {
  if (m_cue_points)
    return true;

  if (m_count != 0 || m_preload_count != 0)
    return false;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  const long long stop = m_start + m_size;
  long long pos = m_start;

  long cue_points_size = 0;

  while (pos < stop) {
    const long long idpos = pos;

    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if (size < 0 || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if (pos + size > stop) {
      return false;
    }

    if (id == libwebm::kMkvCuePoint) {
      if (!PreloadCuePoint(cue_points_size, idpos))
        return false;
    }

    pos += size;  // skip payload
  }
  return true;
}